

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  Particle<(pica::Dimension)2> a;
  Particle<(pica::Dimension)2> a_00;
  Particle<(pica::Dimension)2> particle_00;
  ParticleRef b;
  undefined1 uVar1;
  bool bVar2;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_RDI;
  ConstParticleRef CVar3;
  AssertionResult gtest_ar__1;
  ParticleArray particlesCopy;
  AssertionResult gtest_ar_;
  ParticleType particle;
  int i;
  ParticleArray particles;
  undefined8 uVar4;
  undefined8 uVar5;
  String *pSVar6;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPVar7;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPVar8;
  int iVar10;
  undefined8 uVar9;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffc60;
  Type TVar11;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffc70;
  AssertHelper *pAVar12;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffcb8;
  size_t in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffcd0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  undefined8 in_stack_fffffffffffffcf8;
  String *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  AssertionResult local_2c8 [13];
  String local_1f8 [2];
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *pBStack_1d0;
  undefined8 local_1b8;
  String *pSStack_1b0;
  undefined8 local_1a8;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_1a0;
  undefined8 local_198;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_190;
  undefined8 local_188;
  AssertHelper *pAStack_180;
  AssertionResult local_178;
  undefined8 local_168;
  String *pSStack_160;
  undefined8 local_158;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_150;
  undefined8 local_148;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_140;
  undefined8 local_138;
  AssertHelper *pAStack_130;
  undefined8 local_110;
  String *pSStack_108;
  undefined8 local_100;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_f8;
  undefined8 local_f0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_e8;
  undefined8 local_e0;
  AssertHelper *pAStack_d8;
  int local_cc;
  
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ParticleArraySoA
            (in_stack_fffffffffffffc70);
  for (local_cc = 0; local_cc < 0xd; local_cc = local_cc + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (in_stack_fffffffffffffc80);
    local_138 = local_e0;
    pAStack_130 = pAStack_d8;
    local_148 = local_f0;
    pPStack_140 = pPStack_e8;
    local_158 = local_100;
    pPStack_150 = pPStack_f8;
    local_168 = local_110;
    pSStack_160 = pSStack_108;
    particle_00.position.x._4_4_ = in_stack_fffffffffffffce4;
    particle_00.position.x._0_4_ = in_stack_fffffffffffffce0;
    particle_00.position.y = (double)in_stack_fffffffffffffce8;
    particle_00.p.x._0_4_ = in_stack_fffffffffffffcf0;
    particle_00.p.x._4_4_ = in_stack_fffffffffffffcf4;
    particle_00.p.y = (double)in_stack_fffffffffffffcf8;
    particle_00.p.z = (double)in_stack_fffffffffffffd00;
    particle_00.factor = (FactorType)in_stack_fffffffffffffd08;
    particle_00.invGamma = (GammaType)in_stack_fffffffffffffd10;
    particle_00._56_8_ = in_stack_fffffffffffffd18;
    pPVar7 = pPStack_f8;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>(in_stack_fffffffffffffcd0,particle_00);
    local_188 = local_e0;
    pAStack_180 = pAStack_d8;
    local_198 = local_f0;
    pPStack_190 = pPStack_e8;
    local_1a8 = local_100;
    pPStack_1a0 = pPStack_f8;
    local_1b8 = local_110;
    pSStack_1b0 = pSStack_108;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::back(pPVar7);
    a.position.y = (double)in_stack_fffffffffffffcc8;
    a.position.x = (double)in_stack_fffffffffffffcc0;
    a.p.x = (double)in_stack_fffffffffffffcd0;
    a.p.y = (double)in_stack_fffffffffffffcd8;
    a.p.z._0_4_ = in_stack_fffffffffffffce0;
    a.p.z._4_4_ = in_stack_fffffffffffffce4;
    a.factor = (FactorType)in_stack_fffffffffffffce8;
    a.invGamma._0_4_ = in_stack_fffffffffffffcf0;
    a.invGamma._4_4_ = in_stack_fffffffffffffcf4;
    a._56_8_ = in_stack_fffffffffffffcf8;
    b.super_ConstParticleRef._8_8_ = in_stack_fffffffffffffd08;
    b.super_ConstParticleRef.particles =
         (ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *)in_stack_fffffffffffffd00;
    b.particles = in_stack_fffffffffffffd10;
    b._24_8_ = in_stack_fffffffffffffd18;
    uVar4 = local_1b8;
    pSVar6 = pSStack_1b0;
    pPVar7 = pPStack_1a0;
    uVar5 = local_198;
    pPVar8 = pPStack_190;
    uVar9 = local_188;
    pAVar12 = pAStack_180;
    in_stack_fffffffffffffc80 = pBStack_1d0;
    uVar1 = BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
            eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ParticleRef>
                      (in_RDI,a,b);
    TVar11 = (Type)((ulong)uVar9 >> 0x20);
    iVar10 = (int)((ulong)uVar5 >> 0x20);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)pSVar6,SUB81((ulong)uVar4 >> 0x38,0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar2) {
      testing::Message::Message((Message *)pAVar12);
      testing::internal::GetBoolAssertionFailureMessage
                ((AssertionResult *)in_stack_fffffffffffffcb8,(char *)in_RDI,
                 (char *)CONCAT17(uVar1,in_stack_fffffffffffffca8),(char *)in_stack_fffffffffffffca0
                );
      testing::internal::String::c_str(local_1f8);
      testing::internal::AssertHelper::AssertHelper
                (pAVar12,TVar11,(char *)pPVar8,iVar10,(char *)pPVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffca0,
                 (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pSVar6);
      testing::internal::String::~String(pSVar6);
      testing::Message::~Message((Message *)0x220f4b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x220fe2);
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ParticleArraySoA
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *)
               CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8);
    pAVar12 = pAStack_d8;
    uVar4 = local_e0;
    in_stack_fffffffffffffc60 = pPStack_e8;
    uVar5 = local_110;
    pSVar6 = pSStack_108;
    in_stack_fffffffffffffd08 = local_100;
    pPVar8 = pPStack_f8;
    uVar9 = local_f0;
    CVar3 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::back(pPVar7);
    in_stack_fffffffffffffca0 = CVar3.particles;
    in_stack_fffffffffffffc9c = CVar3.idx;
    a_00.position.y = (double)in_stack_fffffffffffffca0;
    a_00.position.x = (double)in_stack_fffffffffffffcd0;
    a_00.p.x._0_4_ = in_stack_fffffffffffffc9c;
    a_00.p.x._4_4_ = in_stack_fffffffffffffce4;
    a_00.p.y = (double)in_stack_fffffffffffffca0;
    a_00.p.z._0_4_ = in_stack_fffffffffffffc9c;
    a_00.p.z._4_4_ = in_stack_fffffffffffffcf4;
    a_00.factor = (FactorType)uVar5;
    a_00.invGamma = (GammaType)pSVar6;
    a_00._56_8_ = in_stack_fffffffffffffd08;
    CVar3._8_8_ = in_stack_fffffffffffffcc0;
    CVar3.particles = in_stack_fffffffffffffcb8;
    in_stack_fffffffffffffcd8 = in_stack_fffffffffffffca0;
    in_stack_fffffffffffffce0 = in_stack_fffffffffffffc9c;
    in_stack_fffffffffffffce8 = in_stack_fffffffffffffca0;
    in_stack_fffffffffffffcf0 = in_stack_fffffffffffffc9c;
    in_stack_fffffffffffffcf8 = uVar5;
    in_stack_fffffffffffffd00 = pSVar6;
    in_stack_fffffffffffffd10 = pPVar8;
    in_stack_fffffffffffffd18 = uVar9;
    bVar2 = BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
            eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ConstParticleRef>
                      (in_RDI,a_00,CVar3);
    TVar11 = (Type)((ulong)uVar4 >> 0x20);
    iVar10 = (int)((ulong)uVar9 >> 0x20);
    in_stack_fffffffffffffc98 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc98);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)pSVar6,SUB81((ulong)uVar5 >> 0x38,0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
    if (!bVar2) {
      testing::Message::Message((Message *)pAVar12);
      testing::internal::GetBoolAssertionFailureMessage
                ((AssertionResult *)in_stack_fffffffffffffcb8,(char *)in_RDI,
                 (char *)CONCAT17(uVar1,in_stack_fffffffffffffca8),(char *)in_stack_fffffffffffffca0
                );
      testing::internal::String::c_str((String *)&stack0xfffffffffffffcb8);
      testing::internal::AssertHelper::AssertHelper
                (pAVar12,TVar11,(char *)in_stack_fffffffffffffc60,iVar10,(char *)pPVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffca0,
                 (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pSVar6);
      testing::internal::String::~String(pSVar6);
      testing::Message::~Message((Message *)0x2211dd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x221271);
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA
              (in_stack_fffffffffffffc60);
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA
            (in_stack_fffffffffffffc60);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}